

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

void __thiscall PruneReplayer::access_descriptor_set(PruneReplayer *this,Hash hash)

{
  mapped_type pVVar1;
  VkDescriptorSetLayoutBinding *pVVar2;
  uint uVar3;
  size_type sVar4;
  mapped_type *ppVVar5;
  uint32_t i;
  ulong uVar6;
  ulong uVar7;
  Hash local_30;
  
  if (hash != 0) {
    local_30 = hash;
    sVar4 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->accessed_descriptor_sets)._M_h,&local_30);
    if (sVar4 == 0) {
      std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->accessed_descriptor_sets,&local_30);
      ppVVar5 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->descriptor_sets,&local_30);
      pVVar1 = *ppVVar5;
      if (pVVar1 != (mapped_type)0x0) {
        for (uVar7 = 0; uVar7 < pVVar1->bindingCount; uVar7 = uVar7 + 1) {
          pVVar2 = pVVar1->pBindings;
          if (pVVar2[uVar7].pImmutableSamplers != (VkSampler *)0x0) {
            uVar3 = pVVar2[uVar7].descriptorCount;
            if (uVar3 != 0) {
              for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
                if (pVVar2[uVar7].pImmutableSamplers[uVar6] != (VkSampler)0x0) {
                  access_sampler(this,(Hash)pVVar2[uVar7].pImmutableSamplers[uVar6]);
                  uVar3 = pVVar2[uVar7].descriptorCount;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void access_descriptor_set(Hash hash)
	{
		if (!hash)
			return;
		if (accessed_descriptor_sets.count(hash))
			return;
		accessed_descriptor_sets.insert(hash);

		auto *create_info = descriptor_sets[hash];
		if (!create_info)
			return;

		for (uint32_t binding = 0; binding < create_info->bindingCount; binding++)
		{
			auto &bind = create_info->pBindings[binding];
			if (bind.pImmutableSamplers && bind.descriptorCount != 0)
			{
				for (uint32_t i = 0; i < bind.descriptorCount; i++)
					if (bind.pImmutableSamplers[i] != VK_NULL_HANDLE)
						access_sampler((Hash)bind.pImmutableSamplers[i]);
			}
		}
	}